

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

bool __thiscall
MlmWrap::checkBrokerConnected(MlmWrap *this,char *endpoint,int tries,mlm_client_t *temp,int timeout)

{
  char cVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  cVar1 = mlm_client_connected(temp);
  bVar4 = true;
  if (cVar1 == '\0') {
    iVar3 = tries + -1;
    while( true ) {
      iVar2 = mlm_client_connect(temp,endpoint,1000,"temp");
      if ((-1 < iVar2) || (bVar4 = iVar3 == 0, iVar3 = iVar3 + -1, bVar4)) break;
      zclock_sleep(100);
    }
    bVar4 = iVar2 == 0;
    this->connected = bVar4;
  }
  return bVar4;
}

Assistant:

bool MlmWrap::checkBrokerConnected(const char *endpoint, int tries, mlm_client_t* temp, int timeout) {
    bool retval = false;
    int rc = -1;

    if(mlm_client_connected(temp)) //Passed in temp is already connected and verified
        return true;
    while((rc = mlm_client_connect(temp, endpoint, 1000, TEMP_NETWORK_ID)) < 0 && --tries){
        zclock_sleep(100);
    }
    if (rc == 0) {
        retval = true;
    }
    else {
        retval = false;
    }
    connected = retval;
    return(retval);
}